

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::~Player(Player *this)

{
  Player *this_local;
  
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_0014c930;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->zoneNames);
  std::vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::~vector
            (&this->buildingUnitTiles);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector(&this->gameTokens);
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&this->cards);
  BoardFigures::~BoardFigures(&this->boardFigure);
  MonsterCards::~MonsterCards(&this->monsterCard);
  std::__cxx11::string::~string((string *)&this->playerName);
  Subject::~Subject(&this->super_Subject);
  return;
}

Assistant:

Player::~Player() {

}